

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int cursorOnLastPage(BtCursor *pCur)

{
  MemPage *pPage;
  int i;
  BtCursor *pCur_local;
  
  pPage._4_4_ = 0;
  while( true ) {
    if (pCur->iPage <= pPage._4_4_) {
      return 1;
    }
    if (pCur->aiIdx[pPage._4_4_] < pCur->apPage[pPage._4_4_]->nCell) break;
    pPage._4_4_ = pPage._4_4_ + 1;
  }
  return 0;
}

Assistant:

static int cursorOnLastPage(BtCursor *pCur){
  int i;
  assert( pCur->eState==CURSOR_VALID );
  for(i=0; i<pCur->iPage; i++){
    MemPage *pPage = pCur->apPage[i];
    if( pCur->aiIdx[i]<pPage->nCell ) return 0;
  }
  return 1;
}